

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O0

void __thiscall
fizplex::LPTestFeasibility_IsFeasibleForBoundedVarAndRangeRow_Test::TestBody
          (LPTestFeasibility_IsFeasibleForBoundedVarAndRangeRow_Test *this)

{
  initializer_list<double> l;
  initializer_list<double> l_00;
  initializer_list<double> l_01;
  initializer_list<double> l_02;
  initializer_list<double> l_03;
  initializer_list<fizplex::DVector> __l;
  initializer_list<fizplex::DVector> __l_00;
  undefined8 in_RDI;
  double in_stack_fffffffffffffdb8;
  double in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  ColType in_stack_fffffffffffffdcc;
  LP *in_stack_fffffffffffffdd0;
  iterator in_stack_fffffffffffffdd8;
  LP *in_stack_fffffffffffffde0;
  allocator_type *in_stack_fffffffffffffde8;
  LP *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  RowType in_stack_fffffffffffffdfc;
  LP *in_stack_fffffffffffffe00;
  undefined1 ***local_1e8;
  undefined1 ***local_1c8;
  vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *vecs;
  undefined1 feasible;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 uVar1;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 *local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 *local_168;
  undefined8 local_160;
  undefined8 **local_158;
  undefined1 **local_150 [3];
  undefined1 local_138 [24];
  undefined8 **local_120;
  undefined8 local_118;
  undefined1 local_f1 [25];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 **local_80;
  undefined1 **local_78 [3];
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  undefined8 **local_30;
  undefined8 local_28;
  
  uVar1 = 1;
  LP::add_column(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8,9.21032730386439e-318);
  LP::add_row(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,(double)in_stack_fffffffffffffdf0,
              (double)in_stack_fffffffffffffde8);
  LP::add_value(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8,
                (size_t)in_stack_fffffffffffffdd0,
                (double)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  LP::add_logicals(in_stack_fffffffffffffdf0);
  local_80 = local_78;
  local_a0 = 0;
  local_98 = 0x401c000000000000;
  local_90 = &local_a0;
  local_88 = 2;
  l._M_len = (size_type)in_stack_fffffffffffffde0;
  l._M_array = in_stack_fffffffffffffdd8;
  DVector::DVector((DVector *)in_stack_fffffffffffffdd0,l);
  local_80 = (undefined8 **)local_60;
  local_d0 = 0xbff0000000000000;
  local_c8 = 0x4022000000000000;
  local_c0 = &local_d0;
  local_b8 = 2;
  l_00._M_len = (size_type)in_stack_fffffffffffffde0;
  l_00._M_array = in_stack_fffffffffffffdd8;
  DVector::DVector((DVector *)in_stack_fffffffffffffdd0,l_00);
  local_80 = (undefined8 **)local_48;
  local_f1._1_8_ = 0x400c000000000000;
  local_f1._9_8_ = 0;
  local_f1._17_8_ = local_f1 + 1;
  local_d8 = 2;
  l_01._M_len = (size_type)in_stack_fffffffffffffde0;
  l_01._M_array = in_stack_fffffffffffffdd8;
  DVector::DVector((DVector *)in_stack_fffffffffffffdd0,l_01);
  local_30 = local_78;
  local_28 = 3;
  vecs = (vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *)local_f1;
  std::allocator<fizplex::DVector>::allocator((allocator<fizplex::DVector> *)0x1c73a6);
  __l._M_array._4_4_ = in_stack_fffffffffffffdfc;
  __l._M_array._0_4_ = in_stack_fffffffffffffdf8;
  __l._M_len = (size_type)in_stack_fffffffffffffe00;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::vector
            ((vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *)
             in_stack_fffffffffffffdf0,__l,in_stack_fffffffffffffde8);
  LPTestFeasibility::check_feasible
            ((LPTestFeasibility *)CONCAT44(uVar1,in_stack_fffffffffffffe50),
             SUB81((ulong)in_RDI >> 0x38,0),vecs);
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::~vector
            ((vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *)
             in_stack_fffffffffffffdd0);
  std::allocator<fizplex::DVector>::~allocator((allocator<fizplex::DVector> *)0x1c7403);
  local_1c8 = (undefined1 ***)&local_30;
  do {
    local_1c8 = local_1c8 + -3;
    DVector::~DVector((DVector *)0x1c7432);
    feasible = (undefined1)((ulong)in_RDI >> 0x38);
  } while (local_1c8 != local_78);
  local_158 = local_150;
  local_178 = 0xbff8000000000000;
  local_170 = 0;
  local_168 = &local_178;
  local_160 = 2;
  l_02._M_len = (size_type)in_stack_fffffffffffffde0;
  l_02._M_array = in_stack_fffffffffffffdd8;
  DVector::DVector((DVector *)in_stack_fffffffffffffdd0,l_02);
  local_158 = (undefined8 **)local_138;
  local_198 = 0x4010000000000000;
  local_190 = 0;
  local_188 = &local_198;
  local_180 = 2;
  l_03._M_len = (size_type)in_stack_fffffffffffffde0;
  l_03._M_array = in_stack_fffffffffffffdd8;
  DVector::DVector((DVector *)in_stack_fffffffffffffdd0,l_03);
  local_120 = local_150;
  local_118 = 2;
  std::allocator<fizplex::DVector>::allocator((allocator<fizplex::DVector> *)0x1c7539);
  __l_00._M_array._4_4_ = in_stack_fffffffffffffdfc;
  __l_00._M_array._0_4_ = in_stack_fffffffffffffdf8;
  __l_00._M_len = (size_type)in_stack_fffffffffffffe00;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::vector
            ((vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *)
             in_stack_fffffffffffffdf0,__l_00,in_stack_fffffffffffffde8);
  LPTestFeasibility::check_feasible
            ((LPTestFeasibility *)CONCAT44(uVar1,in_stack_fffffffffffffe50),(bool)feasible,vecs);
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::~vector
            ((vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *)
             in_stack_fffffffffffffdd0);
  std::allocator<fizplex::DVector>::~allocator((allocator<fizplex::DVector> *)0x1c7590);
  local_1e8 = (undefined1 ***)&local_120;
  do {
    local_1e8 = local_1e8 + -3;
    DVector::~DVector((DVector *)0x1c75b9);
  } while (local_1e8 != local_150);
  return;
}

Assistant:

TEST_F(LPTestFeasibility, IsFeasibleForBoundedVarAndRangeRow) {
  lp.add_column(ColType::Bounded, -1.0, 5);
  lp.add_row(RowType::Range, -3, 7);
  lp.add_value(0, 0, 2.0);
  lp.add_logicals();

  check_feasible(true, {{0, 7}, {-1, 9}, {3.5, 0}});
  check_feasible(false, {{-1.5, 0}, {4, 0}});
}